

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O2

qint64 __thiscall
QHttpMultiPartIODevice::readData(QHttpMultiPartIODevice *this,char *data,qint64 maxSize)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  qsizetype qVar4;
  qint64 qVar5;
  size_t sVar6;
  pointer pQVar7;
  QHttpPartPrivate *this_00;
  QHttpMultiPartPrivate *pQVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  size_t __n;
  long in_FS_OFFSET;
  long local_90;
  QStringBuilder<QStringBuilder<const_char_(&)[3],_QByteArray_&>,_const_char_(&)[5]> local_70;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = this->multiPart;
  for (uVar12 = 0; uVar12 < (ulong)(pQVar8->parts).d.size; uVar12 = uVar12 + 1) {
    lVar1 = this->readPointer;
    lVar11 = (this->partOffsets).d.ptr[uVar12];
    qVar5 = QHttpPartPrivate::size((pQVar8->parts).d.ptr[uVar12].d.d.ptr);
    pQVar8 = this->multiPart;
    if (lVar1 < qVar5 + lVar11 + (pQVar8->boundary).d.size + 6) break;
  }
  lVar1 = maxSize + -1;
  lVar11 = 0;
  while( true ) {
    __n = maxSize - lVar11;
    lVar9 = lVar11;
    if (__n == 0 || maxSize < lVar11) break;
    pQVar8 = this->multiPart;
    uVar2 = (pQVar8->parts).d.size;
    if ((long)uVar2 <= (long)uVar12) {
      if (uVar12 == uVar2) {
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_70.a.b = &pQVar8->boundary;
        local_70.a.a = (char (*) [3])0x24828d;
        local_70.b = (char (*) [5])0x24d040;
        QStringBuilder<QStringBuilder<const_char_(&)[3],_QByteArray_&>,_const_char_(&)[5]>::
        convertTo<QByteArray>((QByteArray *)&local_58,&local_70);
        qVar4 = local_58.size;
        lVar1 = this->readPointer;
        lVar9 = (**(code **)(*(long *)this + 0x80))(this);
        sVar6 = local_58.size - (long)(qVar4 + (lVar1 - lVar9));
        if ((long)__n <= (long)sVar6) {
          sVar6 = __n;
        }
        pcVar10 = local_58.ptr;
        if (local_58.ptr == (char *)0x0) {
          pcVar10 = (char *)&QByteArray::_empty;
        }
        memcpy(data + lVar11,pcVar10 + (long)(qVar4 + (lVar1 - lVar9)),sVar6);
        this->readPointer = this->readPointer + sVar6;
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
        lVar9 = lVar11 + sVar6;
      }
      break;
    }
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_70.a.b = &pQVar8->boundary;
    local_70.a.a = (char (*) [3])0x24828d;
    local_70.b = (char (*) [5])0x24e55a;
    QStringBuilder<QStringBuilder<const_char_(&)[3],_QByteArray_&>,_const_char_(&)[3]>::
    convertTo<QByteArray>
              ((QByteArray *)&local_58,
               (QStringBuilder<QStringBuilder<const_char_(&)[3],_QByteArray_&>,_const_char_(&)[3]> *
               )&local_70);
    qVar4 = local_58.size;
    lVar9 = this->readPointer - (this->partOffsets).d.ptr[uVar12];
    sVar6 = local_58.size - lVar9;
    if (sVar6 != 0 && lVar9 <= local_58.size) {
      if ((long)sVar6 < (long)__n) {
        __n = sVar6;
      }
      pcVar10 = local_58.ptr;
      if (local_58.ptr == (char *)0x0) {
        pcVar10 = (char *)&QByteArray::_empty;
      }
      memcpy(data + lVar11,pcVar10 + lVar9,__n);
      lVar11 = lVar11 + __n;
      this->readPointer = this->readPointer + __n;
      lVar9 = lVar9 + __n;
    }
    if (((maxSize - lVar11 == 0 || maxSize < lVar11) || (lVar9 < qVar4)) ||
       (qVar5 = QHttpPartPrivate::size((this->multiPart->parts).d.ptr[uVar12].d.d.ptr),
       (long)(qVar4 + qVar5) <= lVar9)) {
LAB_001e7bfa:
      bVar3 = true;
      if ((lVar11 < maxSize) &&
         (qVar5 = QHttpPartPrivate::size((this->multiPart->parts).d.ptr[uVar12].d.d.ptr),
         (long)(qVar4 + qVar5) <= lVar9)) {
        if (lVar11 == lVar1) {
          lVar11 = lVar1;
          local_90 = lVar1;
          bVar3 = false;
        }
        else {
          (data + lVar11)[0] = '\r';
          (data + lVar11)[1] = '\n';
          lVar11 = lVar11 + 2;
          this->readPointer = this->readPointer + 2;
          uVar12 = uVar12 + 1;
          bVar3 = true;
        }
      }
    }
    else {
      pQVar7 = QList<QHttpPart>::data(&this->multiPart->parts);
      this_00 = QSharedDataPointer<QHttpPartPrivate>::operator->(&pQVar7[uVar12].d);
      qVar5 = QHttpPartPrivate::readData(this_00,data + lVar11,maxSize - lVar11);
      if (qVar5 != -1) {
        lVar11 = lVar11 + qVar5;
        this->readPointer = this->readPointer + qVar5;
        lVar9 = lVar9 + qVar5;
        goto LAB_001e7bfa;
      }
      bVar3 = false;
      local_90 = -1;
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    lVar9 = local_90;
    if (!bVar3) break;
  }
  local_90 = lVar9;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_90;
}

Assistant:

qint64 QHttpMultiPartIODevice::readData(char *data, qint64 maxSize)
{
    qint64 bytesRead = 0, index = 0;

    // skip the parts we have already read
    while (index < multiPart->parts.size() &&
           readPointer >= partOffsets.at(index) + multiPart->parts.at(index).d->size()
           + multiPart->boundary.size() + 6) // 6 == 2 boundary dashes, \r\n after boundary, \r\n after multipart
        index++;

    // read the data
    while (bytesRead < maxSize && index < multiPart->parts.size()) {

        // check whether we need to read the boundary of the current part
        QByteArray boundaryData = "--" + multiPart->boundary + "\r\n";
        qint64 boundaryCount = boundaryData.size();
        qint64 partIndex = readPointer - partOffsets.at(index);
        if (partIndex < boundaryCount) {
            qint64 boundaryBytesRead = qMin(boundaryCount - partIndex, maxSize - bytesRead);
            memcpy(data + bytesRead, boundaryData.constData() + partIndex, boundaryBytesRead);
            bytesRead += boundaryBytesRead;
            readPointer += boundaryBytesRead;
            partIndex += boundaryBytesRead;
        }

        // check whether we need to read the data of the current part
        if (bytesRead < maxSize && partIndex >= boundaryCount && partIndex < boundaryCount + multiPart->parts.at(index).d->size()) {
            qint64 dataBytesRead = multiPart->parts[index].d->readData(data + bytesRead, maxSize - bytesRead);
            if (dataBytesRead == -1)
                return -1;
            bytesRead += dataBytesRead;
            readPointer += dataBytesRead;
            partIndex += dataBytesRead;
        }

        // check whether we need to read the ending CRLF of the current part
        if (bytesRead < maxSize && partIndex >= boundaryCount + multiPart->parts.at(index).d->size()) {
            if (bytesRead == maxSize - 1)
                return bytesRead;
            memcpy(data + bytesRead, "\r\n", 2);
            bytesRead += 2;
            readPointer += 2;
            index++;
        }
    }
    // check whether we need to return the final boundary
    if (bytesRead < maxSize && index == multiPart->parts.size()) {
        QByteArray finalBoundary = "--" + multiPart->boundary + "--\r\n";
        qint64 boundaryIndex = readPointer + finalBoundary.size() - size();
        qint64 lastBoundaryBytesRead = qMin(finalBoundary.size() - boundaryIndex, maxSize - bytesRead);
        memcpy(data + bytesRead, finalBoundary.constData() + boundaryIndex, lastBoundaryBytesRead);
        bytesRead += lastBoundaryBytesRead;
        readPointer += lastBoundaryBytesRead;
    }
    return bytesRead;
}